

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O0

void __thiscall
tcu::DefaultHierarchyInflater::enterTestPackage
          (DefaultHierarchyInflater *this,TestPackage *testPackage,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *children)

{
  TestContext *this_00;
  int iVar1;
  undefined4 extraout_var;
  Archive *archive;
  Archive *pkgArchive;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *children_local;
  TestPackage *testPackage_local;
  DefaultHierarchyInflater *this_local;
  
  iVar1 = (*(testPackage->super_TestNode)._vptr_TestNode[6])();
  if ((Archive *)CONCAT44(extraout_var,iVar1) == (Archive *)0x0) {
    this_00 = this->m_testCtx;
    archive = TestContext::getRootArchive(this->m_testCtx);
    TestContext::setCurrentArchive(this_00,archive);
  }
  else {
    TestContext::setCurrentArchive(this->m_testCtx,(Archive *)CONCAT44(extraout_var,iVar1));
  }
  (*(testPackage->super_TestNode)._vptr_TestNode[2])();
  TestNode::getChildren(&testPackage->super_TestNode,children);
  return;
}

Assistant:

void DefaultHierarchyInflater::enterTestPackage (TestPackage* testPackage, vector<TestNode*>& children)
{
	{
		Archive* const	pkgArchive	= testPackage->getArchive();

		if (pkgArchive)
			m_testCtx.setCurrentArchive(*pkgArchive);
		else
			m_testCtx.setCurrentArchive(m_testCtx.getRootArchive());
	}

	testPackage->init();
	testPackage->getChildren(children);
}